

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O2

void __thiscall UdpSender::UdpSender(UdpSender *this,char *host,int port,int bufferSize)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  hostent *phVar4;
  
  this->host = host;
  this->port = port;
  this->bufferSize = bufferSize;
  pcVar3 = (char *)calloc((long)bufferSize,1);
  this->buffer = pcVar3;
  iVar2 = socket(2,2,0);
  this->socketFile = iVar2;
  if (iVar2 < 0) {
    error("ERROR: Could not open socket\n");
  }
  phVar4 = gethostbyname(this->host);
  this->server = (hostent *)phVar4;
  if (phVar4 != (hostent *)0x0) {
    (this->serverAddress).sin_family = 0;
    (this->serverAddress).sin_port = 0;
    (this->serverAddress).sin_addr = 0;
    (this->serverAddress).sin_zero[0] = '\0';
    (this->serverAddress).sin_zero[1] = '\0';
    (this->serverAddress).sin_zero[2] = '\0';
    (this->serverAddress).sin_zero[3] = '\0';
    (this->serverAddress).sin_zero[4] = '\0';
    (this->serverAddress).sin_zero[5] = '\0';
    (this->serverAddress).sin_zero[6] = '\0';
    (this->serverAddress).sin_zero[7] = '\0';
    (this->serverAddress).sin_family = 2;
    memmove(&(this->serverAddress).sin_addr,*phVar4->h_addr_list,(long)phVar4->h_length);
    uVar1 = (ushort)this->port;
    (this->serverAddress).sin_port = uVar1 << 8 | uVar1 >> 8;
    return;
  }
  fprintf(_stderr,"ERROR: Could not find host %s\n",this->host);
  exit(0);
}

Assistant:

UdpSender(char* host, int port, int bufferSize) {
      this->host = host;
      this->port = port;
      this->bufferSize = bufferSize;
      this->buffer = (char*)calloc(this->bufferSize, sizeof(char));
      // create socket
      this->socketFile = socket(AF_INET, SOCK_DGRAM, 0);
      if(this->socketFile < 0) error("ERROR: Could not open socket\n");
      // get DNS entry for server
      this->server = gethostbyname(this->host);
      if(this->server == NULL) {
        fprintf(stderr, "ERROR: Could not find host %s\n", this->host);
        exit(0);
      }
      // construct server address
      bzero((char*)&this->serverAddress, sizeof(this->serverAddress));
      this->serverAddress.sin_family = AF_INET;
      bcopy((char*)this->server->h_addr,
            (char*)&this->serverAddress.sin_addr.s_addr,
            this->server->h_length);
      this->serverAddress.sin_port = htons(this->port);
    }